

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssbinExporter.cpp
# Opt level: O0

size_t __thiscall
Assimp::AssbinChunkWriter::Write(AssbinChunkWriter *this,void *pvBuffer,size_t pSize,size_t pCount)

{
  size_t __n;
  size_t pCount_local;
  size_t pSize_local;
  void *pvBuffer_local;
  AssbinChunkWriter *this_local;
  
  __n = pCount * pSize;
  if (this->cur_size < this->cursor + __n) {
    Grow(this,this->cursor + __n);
  }
  memcpy(this->buffer + this->cursor,pvBuffer,__n);
  this->cursor = __n + this->cursor;
  return pCount;
}

Assistant:

virtual size_t Write(const void* pvBuffer, size_t pSize, size_t pCount) {
        pSize *= pCount;
        if (cursor + pSize > cur_size) {
            Grow(cursor + pSize);
        }

        memcpy(buffer+cursor, pvBuffer, pSize);
        cursor += pSize;

        return pCount;
    }